

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

uint __thiscall MockNamedValue::getUnsignedIntValue(MockNamedValue *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  bool bVar5;
  SimpleString local_28;
  MockNamedValue *local_18;
  MockNamedValue *this_local;
  
  local_18 = this;
  SimpleString::SimpleString(&local_28,"int");
  bVar1 = operator==(&this->type_,&local_28);
  bVar5 = false;
  if (bVar1) {
    bVar5 = -1 < (this->value_).intValue_;
  }
  SimpleString::~SimpleString(&local_28);
  if (bVar5) {
    this_local._4_4_ = (this->value_).unsignedIntValue_;
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pcVar3 = SimpleString::asCharString(&this->type_);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[9])
              (pUVar2,"unsigned int",pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
               ,0xd2,pTVar4);
    this_local._4_4_ = (this->value_).unsignedIntValue_;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int MockNamedValue::getUnsignedIntValue() const
{
    if(type_ == "int" && value_.intValue_ >= 0)
        return (unsigned int)value_.intValue_;
    else
    {
        STRCMP_EQUAL("unsigned int", type_.asCharString());
        return value_.unsignedIntValue_;
    }
}